

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc2.c
# Opt level: O0

Abc_Cex_t * Saig_BmcGenerateCounterExample(Saig_Bmc_t *p)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  int local_30;
  int iVarNum;
  int f;
  int i;
  Aig_Obj_t *pObjFrm;
  Aig_Obj_t *pObj;
  Abc_Cex_t *pCex;
  Saig_Bmc_t *p_local;
  
  iVar1 = Aig_ManRegNum(p->pAig);
  iVar2 = Saig_ManPiNum(p->pAig);
  pObj = (Aig_Obj_t *)Abc_CexAlloc(iVar1,iVar2,p->iFrameFail + 1);
  *(int *)((long)&pObj->field_0 + 4) = p->iFrameFail;
  (pObj->field_0).CioId = p->iOutputFail;
  for (local_30 = 0; local_30 <= p->iFrameFail; local_30 = local_30 + 1) {
    for (iVarNum = 0; iVar1 = Saig_ManPiNum(p->pAig), iVarNum < iVar1; iVarNum = iVarNum + 1) {
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCis,iVarNum);
      pAVar3 = Saig_BmcObjFrame(p,pAVar3,local_30);
      if (((pAVar3 != (Aig_Obj_t *)0x0) && (iVar1 = Saig_BmcSatNum(p,pAVar3), iVar1 != 0)) &&
         (iVar1 = sat_solver_var_value(p->pSat,iVar1), iVar1 != 0)) {
        iVar1 = *(int *)&pObj->pFanin0;
        iVar2 = Saig_ManPiNum(p->pAig);
        Abc_InfoSetBit((uint *)((long)&pObj->pFanin1 + 4),iVar1 + iVar2 * local_30 + iVarNum);
      }
    }
  }
  iVar1 = Saig_ManVerifyCex(p->pAig,(Abc_Cex_t *)pObj);
  if (iVar1 == 0) {
    printf("Saig_BmcGenerateCounterExample(): Counter-example is invalid.\n");
    Abc_CexFree((Abc_Cex_t *)pObj);
    pObj = (Aig_Obj_t *)0x0;
  }
  return (Abc_Cex_t *)pObj;
}

Assistant:

Abc_Cex_t * Saig_BmcGenerateCounterExample( Saig_Bmc_t * p )
{
    Abc_Cex_t * pCex;
    Aig_Obj_t * pObj, * pObjFrm;
    int i, f, iVarNum;
    // start the counter-example
    pCex = Abc_CexAlloc( Aig_ManRegNum(p->pAig), Saig_ManPiNum(p->pAig), p->iFrameFail+1 );
    pCex->iFrame = p->iFrameFail;
    pCex->iPo    = p->iOutputFail;
    // copy the bit data
    for ( f = 0; f <= p->iFrameFail; f++ )
    {
        Saig_ManForEachPi( p->pAig, pObj, i )
        {
            pObjFrm = Saig_BmcObjFrame( p, pObj, f );
            if ( pObjFrm == NULL )
                continue;
            iVarNum = Saig_BmcSatNum( p, pObjFrm );
            if ( iVarNum == 0 )
                continue;
            if ( sat_solver_var_value( p->pSat, iVarNum ) )
                Abc_InfoSetBit( pCex->pData, pCex->nRegs + Saig_ManPiNum(p->pAig) * f + i );
        }
    }
    // verify the counter example
    if ( !Saig_ManVerifyCex( p->pAig, pCex ) )
    {
        printf( "Saig_BmcGenerateCounterExample(): Counter-example is invalid.\n" );
        Abc_CexFree( pCex );
        pCex = NULL;
    }
    return pCex;
}